

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O3

void __thiscall xemmai::t_list::f_resize(t_list *this)

{
  t_object *ptVar1;
  __pointer_type ptVar2;
  size_t sVar3;
  t_type *ptVar4;
  t_queue<128UL> *ptVar5;
  t_queue<256UL> *ptVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  t_object *ptVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  long in_FS_OFFSET;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  uVar13 = this->v_size * 8 + 0xcf;
  uVar11 = uVar13 & 0xffffffffffffff80;
  uVar14 = uVar11 * 2 - 0x50 >> 3;
  this->v_grow = uVar14;
  uVar12 = 0;
  uVar10 = (uVar11 >> 1) - 0x50 >> 3;
  if (uVar13 < 0x100) {
    uVar10 = uVar12;
  }
  this->v_shrink = uVar10;
  ptVar2 = (this->v_tuple).v_p._M_b._M_p;
  ptVar9 = t_heap<xemmai::t_object>::f_allocate_medium
                     ((t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30),
                      uVar11 * 4 - 0x50);
  ptVar9->v_next = (t_object *)0x0;
  *(ulong *)ptVar9->v_data = uVar14;
  uVar13 = *(ulong *)ptVar2->v_data;
  uVar10 = this->v_head;
  if (uVar13 < this->v_size + uVar10) {
    pcVar16 = ptVar9->v_data + 8;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + 1;
      this->v_head = uVar10 + 1;
      t_slot::t_slot((t_slot *)pcVar16,*(t_object **)(ptVar2->v_data + uVar10 * 0x10 + 8));
      *(undefined8 *)(pcVar16 + 8) = *(undefined8 *)(ptVar2->v_data + uVar10 * 0x10 + 0x10);
      uVar10 = this->v_head;
      pcVar16 = pcVar16 + 0x10;
    } while (uVar10 < uVar13);
    this->v_head = 0;
  }
  pcVar16 = ptVar9->v_data + uVar12 * 0x10 + 0x18;
  uVar13 = uVar12 + 1;
  do {
    uVar12 = uVar12 + 1;
    sVar3 = this->v_head;
    this->v_head = sVar3 + 1;
    lVar15 = sVar3 * 0x10;
    t_slot::t_slot((t_slot *)(pcVar16 + -0x10),*(t_object **)(ptVar2->v_data + lVar15 + 8));
    *(t_type **)(pcVar16 + -8) = *(t_type **)(ptVar2->v_data + lVar15 + 0x10);
    auVar8 = _DAT_0017f0d0;
    auVar7 = _DAT_0017f0c0;
    pcVar16 = pcVar16 + 0x10;
    uVar13 = uVar13 + 1;
  } while (uVar12 < this->v_size);
  if (uVar13 < this->v_grow) {
    uVar13 = this->v_grow;
  }
  lVar15 = (uVar13 - uVar12) + -1;
  auVar17._8_4_ = (int)lVar15;
  auVar17._0_8_ = lVar15;
  auVar17._12_4_ = (int)((ulong)lVar15 >> 0x20);
  uVar10 = 0;
  auVar17 = auVar17 ^ _DAT_0017f0d0;
  do {
    auVar18._8_4_ = (int)uVar10;
    auVar18._0_8_ = uVar10;
    auVar18._12_4_ = (int)(uVar10 >> 0x20);
    auVar18 = (auVar18 | auVar7) ^ auVar8;
    if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                auVar17._4_4_ < auVar18._4_4_) & 1)) {
      pcVar16[-0x10] = '\0';
      pcVar16[-0xf] = '\0';
      pcVar16[-0xe] = '\0';
      pcVar16[-0xd] = '\0';
      pcVar16[-0xc] = '\0';
      pcVar16[-0xb] = '\0';
      pcVar16[-10] = '\0';
      pcVar16[-9] = '\0';
    }
    if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
        auVar18._12_4_ <= auVar17._12_4_) {
      pcVar16[0] = '\0';
      pcVar16[1] = '\0';
      pcVar16[2] = '\0';
      pcVar16[3] = '\0';
      pcVar16[4] = '\0';
      pcVar16[5] = '\0';
      pcVar16[6] = '\0';
      pcVar16[7] = '\0';
    }
    uVar10 = uVar10 + 2;
    pcVar16 = pcVar16 + 0x20;
  } while (((uVar13 - uVar12) + 1 & 0xfffffffffffffffe) != uVar10);
  ptVar4 = *(t_type **)(*(long *)(in_FS_OFFSET + -0x78) + 0x1a8);
  ptVar5 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *ptVar5->v_head = (t_object *)&ptVar4[-1].f_less;
  if (ptVar5->v_head == ptVar5->v_next) {
    t_slot::t_queue<128UL>::f_next(ptVar5);
  }
  else {
    ptVar5->v_head = ptVar5->v_head + 1;
  }
  ptVar9->v_type = ptVar4;
  ptVar6 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *ptVar6->v_head = ptVar9;
  if (ptVar6->v_head == ptVar6->v_next) {
    t_slot::t_queue<256UL>::f_next(ptVar6);
  }
  else {
    ptVar6->v_head = ptVar6->v_head + 1;
  }
  if ((t_object *)0x4 < ptVar9) {
    ptVar5 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
    *ptVar5->v_head = ptVar9;
    if (ptVar5->v_head == ptVar5->v_next) {
      t_slot::t_queue<128UL>::f_next(ptVar5);
    }
    else {
      ptVar5->v_head = ptVar5->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = (this->v_tuple).v_p._M_b._M_p;
  (this->v_tuple).v_p._M_b._M_p = ptVar9;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    ptVar6 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
    *ptVar6->v_head = ptVar1;
    if (ptVar6->v_head == ptVar6->v_next) {
      t_slot::t_queue<256UL>::f_next(ptVar6);
    }
    else {
      ptVar6->v_head = ptVar6->v_head + 1;
    }
  }
  this->v_head = 0;
  return;
}

Assistant:

void t_list::f_resize()
{
	auto size = t_object::f_capacity_to_size<t_tuple, t_slot>(v_size);
	v_grow = t_object::f_size_to_capacity<t_tuple, t_slot>(size * 2);
	v_shrink = size < sizeof(t_object) * 2 ? 0 : t_object::f_size_to_capacity<t_tuple, t_slot>(size / 2);
	auto& tuple0 = v_tuple->f_as<t_tuple>();
	v_tuple = t_tuple::f_instantiate(v_grow, [&](auto& tuple1)
	{
		size_t n = tuple0.f_size();
		size_t i = 0;
		if (v_head + v_size > n) {
			do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (v_head < n);
			v_head = 0;
		}
		do new(&tuple1[i++]) t_svalue(tuple0[v_head++]); while (i < v_size);
		do new(&tuple1[i++]) t_svalue; while (i < v_grow);
	});
	v_head = 0;
}